

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

bool __thiscall
diligent_spirv_cross::CompilerGLSL::member_is_non_native_row_major_matrix
          (CompilerGLSL *this,SPIRType *type,uint32_t index)

{
  bool bVar1;
  SPIRType *pSVar2;
  runtime_error *this_00;
  uint uVar3;
  SPIRType mbr_type;
  undefined1 local_168 [192];
  uint *local_a8;
  size_t local_a0;
  uint local_90 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_50;
  
  if ((this->backend).native_row_major_matrix == true) {
    uVar3 = 0x81;
    if ((this->options).es != false) {
      uVar3 = 299;
    }
    if (uVar3 < (this->options).version) {
      return false;
    }
  }
  bVar1 = Compiler::has_member_decoration
                    (&this->super_Compiler,(TypeID)(type->super_IVariant).self.id,index,
                     DecorationRowMajor);
  if (!bVar1) {
    return false;
  }
  pSVar2 = Variant::get<diligent_spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.
                      ptr + (type->member_types).
                            super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                            .ptr[index].id);
  SPIRType::SPIRType((SPIRType *)local_168,pSVar2);
  if (local_168._28_4_ != local_168._24_4_) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (this_00,"Row-major matrices must be square on this platform.");
    *(undefined ***)this_00 = &PTR__runtime_error_00b5dcd0;
    __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_168._0_8_ = &PTR__SPIRType_00b5dcf8;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_50);
  local_a0 = 0;
  if (local_a8 != local_90) {
    free(local_a8);
  }
  local_168._144_8_ = 0;
  if ((TypedID<(diligent_spirv_cross::Types)1> *)local_168._136_8_ !=
      (TypedID<(diligent_spirv_cross::Types)1> *)(local_168 + 0xa0)) {
    free((void *)local_168._136_8_);
  }
  local_168._96_8_ = 0;
  if ((undefined1 *)local_168._88_8_ != local_168 + 0x70) {
    free((void *)local_168._88_8_);
  }
  local_168._40_8_ = 0;
  if ((undefined1 *)local_168._32_8_ != local_168 + 0x38) {
    free((void *)local_168._32_8_);
  }
  return true;
}

Assistant:

bool CompilerGLSL::member_is_non_native_row_major_matrix(const SPIRType &type, uint32_t index)
{
	// Natively supported row-major matrices do not need to be converted.
	if (backend.native_row_major_matrix && !is_legacy())
		return false;

	// Non-matrix or column-major matrix types do not need to be converted.
	if (!has_member_decoration(type.self, index, DecorationRowMajor))
		return false;

	// Only square row-major matrices can be converted at this time.
	// Converting non-square matrices will require defining custom GLSL function that
	// swaps matrix elements while retaining the original dimensional form of the matrix.
	const auto mbr_type = get<SPIRType>(type.member_types[index]);
	if (mbr_type.columns != mbr_type.vecsize)
		SPIRV_CROSS_THROW("Row-major matrices must be square on this platform.");

	return true;
}